

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O0

void Mvc_CoverMakeEmpty(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *local_30;
  Mvc_Cube_t *local_28;
  Mvc_Cube_t *local_20;
  Mvc_Cube_t *pCube2;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  pCube2 = (pCover->lCubes).pHead;
  if (pCube2 == (Mvc_Cube_t *)0x0) {
    local_28 = (Mvc_Cube_t *)0x0;
  }
  else {
    local_28 = pCube2->pNext;
  }
  local_20 = local_28;
  while (pCube2 != (Mvc_Cube_t *)0x0) {
    Mvc_CubeFree(pCover,pCube2);
    pCube2 = local_20;
    if (local_20 == (Mvc_Cube_t *)0x0) {
      local_30 = (Mvc_Cube_t *)0x0;
    }
    else {
      local_30 = local_20->pNext;
    }
    local_20 = local_30;
  }
  (pCover->lCubes).nItems = 0;
  (pCover->lCubes).pHead = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).pTail = (Mvc_Cube_t *)0x0;
  return;
}

Assistant:

void Mvc_CoverMakeEmpty( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube, * pCube2;
    Mvc_CoverForEachCubeSafe( pCover, pCube, pCube2 )
        Mvc_CubeFree( pCover, pCube );
    pCover->lCubes.nItems = 0;
    pCover->lCubes.pHead = NULL;
    pCover->lCubes.pTail = NULL;
}